

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEnc_Finish(CLzmaEncHandle pp)

{
  CLzmaEncHandle pp_local;
  
  return;
}

Assistant:

void LzmaEnc_Finish(CLzmaEncHandle pp) {
#ifdef COMPRESS_MF_MT
  CLzmaEnc* p = (CLzmaEnc*)pp;
  if (p->mtMode)
    MatchFinderMt_ReleaseStream(&p->matchFinderMt);
#else
  pp = pp;
#endif
}